

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall FTypeTable::AddType(FTypeTable *this,PType *type)

{
  MetaClass *pMVar1;
  size_t sVar2;
  PType *pPVar3;
  size_t bucket;
  intptr_t parm2;
  intptr_t parm1;
  PClass *metatype;
  PType *type_local;
  FTypeTable *this_local;
  
  metatype = (PClass *)type;
  type_local = (PType *)this;
  pMVar1 = PType::GetClass(type);
  parm1 = (intptr_t)pMVar1->TypeTableType;
  (**(code **)(*(long *)&(metatype->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xa0))
            (metatype,&parm2,&bucket);
  sVar2 = Hash((PClass *)parm1,parm2,bucket);
  pPVar3 = FindType(this,(PClass *)parm1,parm2,bucket,(size_t *)0x0);
  if (pPVar3 != (PType *)0x0) {
    __assert_fail("FindType(metatype, parm1, parm2, NULL) == NULL && \"Type must not be inserted more than once\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0xe3e,"void FTypeTable::AddType(PType *)");
  }
  (metatype->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  HashNext = this->TypeHash[sVar2 % 0x3fd];
  this->TypeHash[sVar2 % 0x3fd] = (PType *)metatype;
  GC::WriteBarrier((DObject *)metatype);
  return;
}

Assistant:

void FTypeTable::AddType(PType *type)
{
	PClass *metatype;
	intptr_t parm1, parm2;
	size_t bucket;

	metatype = type->GetClass()->TypeTableType;
	type->GetTypeIDs(parm1, parm2);
	bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	assert(FindType(metatype, parm1, parm2, NULL) == NULL && "Type must not be inserted more than once");

	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}